

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void jmp_patchins(FuncState *fs,BCPos pc,BCPos dest)

{
  uint uVar1;
  
  uVar1 = (dest - pc) + 0x7fff;
  if (uVar1 < 0x10000) {
    *(short *)((long)&fs->bcbase[pc].ins + 2) = (short)uVar1;
    return;
  }
  err_syntax(fs->ls,LJ_ERR_XJUMP);
}

Assistant:

static void jmp_patchins(FuncState *fs, BCPos pc, BCPos dest)
{
  BCIns *jmp = &fs->bcbase[pc].ins;
  BCPos offset = dest-(pc+1)+BCBIAS_J;
  lj_assertFS(dest != NO_JMP, "uninitialized jump target");
  if (offset > BCMAX_D)
    err_syntax(fs->ls, LJ_ERR_XJUMP);
  setbc_d(jmp, offset);
}